

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

bool llvm::sys::getHostCPUFeatures(StringMap<bool,_llvm::MallocAllocator> *Features)

{
  StringMap<bool,_llvm::MallocAllocator> *pSVar1;
  bool bVar2;
  uint uVar3;
  bool *pbVar4;
  bool local_1382;
  byte local_1381;
  byte local_1359;
  byte local_1331;
  byte local_130a;
  byte local_1309;
  bool local_12e1;
  bool local_12b9;
  bool local_1291;
  bool local_1269;
  bool local_1241;
  byte local_1219;
  byte local_11f1;
  byte local_11c9;
  byte local_11a1;
  byte local_1179;
  bool local_1151;
  bool local_1129;
  byte local_1101;
  bool local_10d9;
  bool local_10b1;
  byte local_1089;
  bool local_1061;
  byte local_1039;
  byte local_1011;
  bool local_fe9;
  byte local_fc1;
  byte local_f99;
  byte local_f71;
  bool local_f49;
  bool local_f21;
  byte local_ef9;
  bool local_ed1;
  bool local_ea9;
  byte local_e81;
  byte local_e59;
  bool local_e31;
  bool local_e09;
  bool local_de1;
  byte local_db9;
  bool local_d91;
  bool local_d69;
  bool local_d42;
  byte local_d41;
  bool local_d19;
  bool local_cf2;
  byte local_cf1;
  bool local_cc9;
  bool local_ca1;
  byte local_c79;
  bool local_c51;
  byte local_c29;
  bool local_c01;
  bool local_bd9;
  bool local_bb1;
  bool local_b8a;
  byte local_b89;
  byte local_b61;
  byte local_b39;
  byte local_b11;
  bool local_aea;
  bool local_ae9;
  StringRef local_928;
  byte local_911;
  undefined1 auStack_910 [7];
  bool HasLeaf14;
  StringRef local_900;
  StringRef local_8f0;
  byte local_8d9;
  undefined1 auStack_8d8 [7];
  bool HasLeafD;
  StringRef local_8c8;
  StringRef local_8b8;
  StringRef local_8a8;
  StringRef local_898;
  StringRef local_888;
  StringRef local_878;
  StringRef local_868;
  StringRef local_858;
  StringRef local_848;
  StringRef local_838;
  StringRef local_828;
  StringRef local_818;
  StringRef local_808;
  StringRef local_7f8;
  StringRef local_7e8;
  StringRef local_7d8;
  StringRef local_7c8;
  StringRef local_7b8;
  StringRef local_7a8;
  StringRef local_798;
  StringRef local_788;
  StringRef local_778;
  StringRef local_768;
  StringRef local_758;
  StringRef local_748;
  StringRef local_738;
  StringRef local_728;
  StringRef local_718;
  StringRef local_708;
  StringRef local_6f8;
  StringRef local_6e8;
  StringRef local_6d8;
  StringRef local_6c8;
  StringRef local_6b8;
  StringRef local_6a8;
  StringRef local_698;
  byte local_681;
  undefined1 auStack_680 [7];
  bool HasLeaf7;
  StringRef local_670;
  byte local_659;
  undefined1 auStack_658 [7];
  bool HasExtLeaf8;
  StringRef local_648;
  StringRef local_638;
  StringRef local_628;
  StringRef local_618;
  StringRef local_608;
  StringRef local_5f8;
  StringRef local_5e8;
  StringRef local_5d8;
  byte local_5c5;
  uint local_5c4;
  undefined1 auStack_5c0 [3];
  bool HasExtLeaf1;
  uint MaxExtLevel;
  StringRef local_5b0;
  StringRef local_5a0;
  StringRef local_590;
  bool local_57a;
  bool local_579;
  undefined1 auStack_578 [6];
  bool HasAVX512Save;
  bool HasAVXSave;
  StringRef local_568;
  StringRef local_558;
  StringRef local_548;
  StringRef local_538;
  StringRef local_528;
  StringRef local_518;
  StringRef local_508;
  StringRef local_4f8;
  StringRef local_4e8;
  StringRef local_4d8;
  StringRef local_4c8;
  StringRef local_4b8;
  StringRef local_4a8;
  uint local_498;
  uint uStack_494;
  anon_union_12_2_94730053 text;
  uint MaxLevel;
  uint EDX;
  uint ECX;
  uint EBX;
  uint EAX;
  StringMap<bool,_llvm::MallocAllocator> *Features_local;
  char *local_468;
  StringRef *local_460;
  char *local_458;
  StringRef *local_450;
  char *local_448;
  StringRef *local_440;
  char *local_438;
  StringRef *local_430;
  char *local_428;
  StringRef *local_420;
  char *local_418;
  StringRef *local_410;
  char *local_408;
  StringRef *local_400;
  char *local_3f8;
  StringRef *local_3f0;
  char *local_3e8;
  StringRef *local_3e0;
  char *local_3d8;
  StringRef *local_3d0;
  char *local_3c8;
  StringRef *local_3c0;
  char *local_3b8;
  StringRef *local_3b0;
  char *local_3a8;
  StringRef *local_3a0;
  char *local_398;
  undefined1 *local_390;
  char *local_388;
  StringRef *local_380;
  char *local_378;
  StringRef *local_370;
  char *local_368;
  StringRef *local_360;
  char *local_358;
  undefined1 *local_350;
  char *local_348;
  StringRef *local_340;
  char *local_338;
  StringRef *local_330;
  char *local_328;
  StringRef *local_320;
  char *local_318;
  StringRef *local_310;
  char *local_308;
  StringRef *local_300;
  char *local_2f8;
  StringRef *local_2f0;
  char *local_2e8;
  StringRef *local_2e0;
  char *local_2d8;
  StringRef *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  StringRef *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  StringRef *local_290;
  char *local_288;
  StringRef *local_280;
  char *local_278;
  StringRef *local_270;
  char *local_268;
  StringRef *local_260;
  char *local_258;
  StringRef *local_250;
  char *local_248;
  StringRef *local_240;
  char *local_238;
  StringRef *local_230;
  char *local_228;
  StringRef *local_220;
  char *local_218;
  StringRef *local_210;
  char *local_208;
  StringRef *local_200;
  char *local_1f8;
  StringRef *local_1f0;
  char *local_1e8;
  StringRef *local_1e0;
  char *local_1d8;
  StringRef *local_1d0;
  char *local_1c8;
  StringRef *local_1c0;
  char *local_1b8;
  StringRef *local_1b0;
  char *local_1a8;
  StringRef *local_1a0;
  char *local_198;
  StringRef *local_190;
  char *local_188;
  StringRef *local_180;
  char *local_178;
  StringRef *local_170;
  char *local_168;
  StringRef *local_160;
  char *local_158;
  StringRef *local_150;
  char *local_148;
  StringRef *local_140;
  char *local_138;
  StringRef *local_130;
  char *local_128;
  StringRef *local_120;
  char *local_118;
  StringRef *local_110;
  char *local_108;
  StringRef *local_100;
  char *local_f8;
  StringRef *local_f0;
  char *local_e8;
  StringRef *local_e0;
  char *local_d8;
  StringRef *local_d0;
  char *local_c8;
  StringRef *local_c0;
  char *local_b8;
  StringRef *local_b0;
  char *local_a8;
  StringRef *local_a0;
  char *local_98;
  StringRef *local_90;
  char *local_88;
  StringRef *local_80;
  char *local_78;
  StringRef *local_70;
  char *local_68;
  StringRef *local_60;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  StringRef *local_40;
  char *local_38;
  StringRef *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  StringRef *local_10;
  
  ECX = 0;
  EDX = 0;
  MaxLevel = 0;
  text.u[2] = 0;
  _EBX = Features;
  bVar2 = getX86CpuIDAndInfo(0,text.u + 1,&local_498,text.u,&uStack_494);
  if ((bVar2) || (text.u[1] == 0)) {
    Features_local._7_1_ = false;
  }
  else {
    getX86CpuIDAndInfo(1,&ECX,&EDX,&MaxLevel,text.u + 2);
    pSVar1 = _EBX;
    uVar3 = text.u[2] >> 0xf;
    local_460 = &local_4a8;
    local_468 = "cmov";
    strlen("cmov");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_4a8);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = text.u[2] >> 0x17;
    local_450 = &local_4b8;
    local_458 = "mmx";
    strlen("mmx");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_4b8);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = text.u[2] >> 0x19;
    local_440 = &local_4c8;
    local_448 = "sse";
    strlen("sse");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_4c8);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = text.u[2] >> 0x1a;
    local_430 = &local_4d8;
    local_438 = "sse2";
    strlen("sse2");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_4d8);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel & 1;
    local_420 = &local_4e8;
    local_428 = "sse3";
    strlen("sse3");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_4e8);
    pSVar1 = _EBX;
    *pbVar4 = uVar3 != 0;
    uVar3 = MaxLevel >> 1;
    local_410 = &local_4f8;
    local_418 = "pclmul";
    strlen("pclmul");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_4f8);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 9;
    local_400 = &local_508;
    local_408 = "ssse3";
    strlen("ssse3");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_508);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 0xd;
    local_3f0 = &local_518;
    local_3f8 = "cx16";
    strlen("cx16");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_518);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 0x13;
    local_3e0 = &local_528;
    local_3e8 = "sse4.1";
    strlen("sse4.1");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_528);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 0x14;
    local_3d0 = &local_538;
    local_3d8 = "sse4.2";
    strlen("sse4.2");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_538);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 0x16;
    local_3c0 = &local_548;
    local_3c8 = "movbe";
    strlen("movbe");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_548);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 0x17;
    local_3b0 = &local_558;
    local_3b8 = "popcnt";
    strlen("popcnt");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_558);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 0x19;
    local_3a0 = &local_568;
    local_3a8 = "aes";
    strlen("aes");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_568);
    pSVar1 = _EBX;
    *pbVar4 = (uVar3 & 1) != 0;
    uVar3 = MaxLevel >> 0x1e;
    local_390 = auStack_578;
    local_398 = "rdrnd";
    strlen("rdrnd");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,_auStack_578);
    *pbVar4 = (uVar3 & 1) != 0;
    local_ae9 = false;
    if (((MaxLevel >> 0x1b & 1) != 0) && (local_ae9 = false, (MaxLevel >> 0x1c & 1) != 0)) {
      bVar2 = getX86XCR0(&ECX,text.u + 2);
      local_ae9 = false;
      if (!bVar2) {
        local_ae9 = (ECX & 6) == 6;
      }
    }
    pSVar1 = _EBX;
    local_579 = local_ae9;
    local_aea = local_ae9 != false && (ECX & 0xe0) == 0xe0;
    local_57a = local_aea;
    local_380 = &local_590;
    local_388 = "avx";
    strlen("avx");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_590);
    pSVar1 = _EBX;
    *pbVar4 = local_ae9;
    local_b11 = 0;
    if ((MaxLevel >> 0xc & 1) != 0) {
      local_b11 = local_579;
    }
    local_370 = &local_5a0;
    local_378 = "fma";
    strlen("fma");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_5a0);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_b11 & 1);
    local_b39 = 0;
    if ((MaxLevel >> 0x1a & 1) != 0) {
      local_b39 = local_579;
    }
    local_360 = &local_5b0;
    local_368 = "xsave";
    strlen("xsave");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_5b0);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_b39 & 1);
    local_b61 = 0;
    if ((MaxLevel >> 0x1d & 1) != 0) {
      local_b61 = local_579;
    }
    local_350 = auStack_5c0;
    local_358 = "f16c";
    strlen("f16c");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,_auStack_5c0);
    *pbVar4 = (bool)(local_b61 & 1);
    getX86CpuIDAndInfo(0x80000000,&local_5c4,&EDX,&MaxLevel,text.u + 2);
    local_b89 = 0;
    if (0x80000000 < local_5c4) {
      bVar2 = getX86CpuIDAndInfo(0x80000001,&ECX,&EDX,&MaxLevel,text.u + 2);
      local_b89 = bVar2 ^ 0xff;
    }
    pSVar1 = _EBX;
    local_5c5 = local_b89 & 1;
    local_b8a = local_5c5 != 0 && (MaxLevel & 1) != 0;
    local_340 = &local_5d8;
    local_348 = "sahf";
    strlen("sahf");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_5d8);
    pSVar1 = _EBX;
    *pbVar4 = local_b8a;
    local_bb1 = (local_5c5 & 1) != 0 && (MaxLevel >> 5 & 1) != 0;
    local_330 = &local_5e8;
    local_338 = "lzcnt";
    strlen("lzcnt");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_5e8);
    pSVar1 = _EBX;
    *pbVar4 = local_bb1;
    local_bd9 = (local_5c5 & 1) != 0 && (MaxLevel >> 6 & 1) != 0;
    local_320 = &local_5f8;
    local_328 = "sse4a";
    strlen("sse4a");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_5f8);
    pSVar1 = _EBX;
    *pbVar4 = local_bd9;
    local_c01 = (local_5c5 & 1) != 0 && (MaxLevel >> 8 & 1) != 0;
    local_310 = &local_608;
    local_318 = "prfchw";
    strlen("prfchw");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_608);
    pSVar1 = _EBX;
    *pbVar4 = local_c01;
    local_c29 = 0;
    if (((local_5c5 & 1) != 0) && (local_c29 = 0, (MaxLevel >> 0xb & 1) != 0)) {
      local_c29 = local_579;
    }
    local_300 = &local_618;
    local_308 = "xop";
    strlen("xop");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_618);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_c29 & 1);
    local_c51 = (local_5c5 & 1) != 0 && (MaxLevel >> 0xf & 1) != 0;
    local_2f0 = &local_628;
    local_2f8 = "lwp";
    strlen("lwp");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_628);
    pSVar1 = _EBX;
    *pbVar4 = local_c51;
    local_c79 = 0;
    if (((local_5c5 & 1) != 0) && (local_c79 = 0, (MaxLevel >> 0x10 & 1) != 0)) {
      local_c79 = local_579;
    }
    local_2e0 = &local_638;
    local_2e8 = "fma4";
    strlen("fma4");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_638);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_c79 & 1);
    local_ca1 = (local_5c5 & 1) != 0 && (MaxLevel >> 0x15 & 1) != 0;
    local_2d0 = &local_648;
    local_2d8 = "tbm";
    strlen("tbm");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_648);
    pSVar1 = _EBX;
    *pbVar4 = local_ca1;
    local_cc9 = (local_5c5 & 1) != 0 && (MaxLevel >> 0x1d & 1) != 0;
    local_2c0 = auStack_658;
    local_2c8 = "mwaitx";
    strlen("mwaitx");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,_auStack_658);
    *pbVar4 = local_cc9;
    local_cf1 = 0;
    if (0x80000007 < local_5c4) {
      bVar2 = getX86CpuIDAndInfo(0x80000008,&ECX,&EDX,&MaxLevel,text.u + 2);
      local_cf1 = bVar2 ^ 0xff;
    }
    pSVar1 = _EBX;
    local_659 = local_cf1 & 1;
    local_cf2 = local_659 != 0 && (EDX & 1) != 0;
    local_2b0 = &local_670;
    local_2b8 = "clzero";
    strlen("clzero");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_670);
    pSVar1 = _EBX;
    *pbVar4 = local_cf2;
    local_d19 = (local_659 & 1) != 0 && (EDX >> 9 & 1) != 0;
    local_2a0 = auStack_680;
    local_2a8 = "wbnoinvd";
    strlen("wbnoinvd");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,_auStack_680);
    *pbVar4 = local_d19;
    local_d41 = 0;
    if (6 < text.u[1]) {
      bVar2 = getX86CpuIDAndInfoEx(7,0,&ECX,&EDX,&MaxLevel,text.u + 2);
      local_d41 = bVar2 ^ 0xff;
    }
    pSVar1 = _EBX;
    local_681 = local_d41 & 1;
    local_d42 = local_681 != 0 && (EDX & 1) != 0;
    local_290 = &local_698;
    local_298 = "fsgsbase";
    strlen("fsgsbase");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_698);
    pSVar1 = _EBX;
    *pbVar4 = local_d42;
    local_d69 = (local_681 & 1) != 0 && (EDX >> 2 & 1) != 0;
    local_280 = &local_6a8;
    local_288 = "sgx";
    strlen("sgx");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_6a8);
    pSVar1 = _EBX;
    *pbVar4 = local_d69;
    local_d91 = (local_681 & 1) != 0 && (EDX >> 3 & 1) != 0;
    local_270 = &local_6b8;
    local_278 = "bmi";
    strlen("bmi");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_6b8);
    pSVar1 = _EBX;
    *pbVar4 = local_d91;
    local_db9 = 0;
    if (((local_681 & 1) != 0) && (local_db9 = 0, (EDX >> 5 & 1) != 0)) {
      local_db9 = local_579;
    }
    local_260 = &local_6c8;
    local_268 = "avx2";
    strlen("avx2");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_6c8);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_db9 & 1);
    local_de1 = (local_681 & 1) != 0 && (EDX >> 8 & 1) != 0;
    local_250 = &local_6d8;
    local_258 = "bmi2";
    strlen("bmi2");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_6d8);
    pSVar1 = _EBX;
    *pbVar4 = local_de1;
    local_e09 = (local_681 & 1) != 0 && (EDX >> 10 & 1) != 0;
    local_240 = &local_6e8;
    local_248 = "invpcid";
    strlen("invpcid");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_6e8);
    pSVar1 = _EBX;
    *pbVar4 = local_e09;
    local_e31 = (local_681 & 1) != 0 && (EDX >> 0xb & 1) != 0;
    local_230 = &local_6f8;
    local_238 = "rtm";
    strlen("rtm");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_6f8);
    pSVar1 = _EBX;
    *pbVar4 = local_e31;
    local_e59 = 0;
    if (((local_681 & 1) != 0) && (local_e59 = 0, (EDX >> 0x10 & 1) != 0)) {
      local_e59 = local_57a;
    }
    local_220 = &local_708;
    local_228 = "avx512f";
    strlen("avx512f");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_708);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_e59 & 1);
    local_e81 = 0;
    if (((local_681 & 1) != 0) && (local_e81 = 0, (EDX >> 0x11 & 1) != 0)) {
      local_e81 = local_57a;
    }
    local_210 = &local_718;
    local_218 = "avx512dq";
    strlen("avx512dq");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_718);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_e81 & 1);
    local_ea9 = (local_681 & 1) != 0 && (EDX >> 0x12 & 1) != 0;
    local_200 = &local_728;
    local_208 = "rdseed";
    strlen("rdseed");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_728);
    pSVar1 = _EBX;
    *pbVar4 = local_ea9;
    local_ed1 = (local_681 & 1) != 0 && (EDX >> 0x13 & 1) != 0;
    local_1f0 = &local_738;
    local_1f8 = "adx";
    strlen("adx");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_738);
    pSVar1 = _EBX;
    *pbVar4 = local_ed1;
    local_ef9 = 0;
    if (((local_681 & 1) != 0) && (local_ef9 = 0, (EDX >> 0x15 & 1) != 0)) {
      local_ef9 = local_57a;
    }
    local_1e0 = &local_748;
    local_1e8 = "avx512ifma";
    strlen("avx512ifma");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_748);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_ef9 & 1);
    local_f21 = (local_681 & 1) != 0 && (EDX >> 0x17 & 1) != 0;
    local_1d0 = &local_758;
    local_1d8 = "clflushopt";
    strlen("clflushopt");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_758);
    pSVar1 = _EBX;
    *pbVar4 = local_f21;
    local_f49 = (local_681 & 1) != 0 && (EDX >> 0x18 & 1) != 0;
    local_1c0 = &local_768;
    local_1c8 = "clwb";
    strlen("clwb");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_768);
    pSVar1 = _EBX;
    *pbVar4 = local_f49;
    local_f71 = 0;
    if (((local_681 & 1) != 0) && (local_f71 = 0, (EDX >> 0x1a & 1) != 0)) {
      local_f71 = local_57a;
    }
    local_1b0 = &local_778;
    local_1b8 = "avx512pf";
    strlen("avx512pf");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_778);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_f71 & 1);
    local_f99 = 0;
    if (((local_681 & 1) != 0) && (local_f99 = 0, (EDX >> 0x1b & 1) != 0)) {
      local_f99 = local_57a;
    }
    local_1a0 = &local_788;
    local_1a8 = "avx512er";
    strlen("avx512er");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_788);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_f99 & 1);
    local_fc1 = 0;
    if (((local_681 & 1) != 0) && (local_fc1 = 0, (EDX >> 0x1c & 1) != 0)) {
      local_fc1 = local_57a;
    }
    local_190 = &local_798;
    local_198 = "avx512cd";
    strlen("avx512cd");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_798);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_fc1 & 1);
    local_fe9 = (local_681 & 1) != 0 && (EDX >> 0x1d & 1) != 0;
    local_180 = &local_7a8;
    local_188 = "sha";
    strlen("sha");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_7a8);
    pSVar1 = _EBX;
    *pbVar4 = local_fe9;
    local_1011 = 0;
    if (((local_681 & 1) != 0) && (local_1011 = 0, (EDX >> 0x1e & 1) != 0)) {
      local_1011 = local_57a;
    }
    local_170 = &local_7b8;
    local_178 = "avx512bw";
    strlen("avx512bw");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_7b8);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_1011 & 1);
    local_1039 = 0;
    if (((local_681 & 1) != 0) && (local_1039 = 0, (int)EDX < 0)) {
      local_1039 = local_57a;
    }
    local_160 = &local_7c8;
    local_168 = "avx512vl";
    strlen("avx512vl");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_7c8);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_1039 & 1);
    local_1061 = (local_681 & 1) != 0 && (MaxLevel & 1) != 0;
    local_150 = &local_7d8;
    local_158 = "prefetchwt1";
    strlen("prefetchwt1");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_7d8);
    pSVar1 = _EBX;
    *pbVar4 = local_1061;
    local_1089 = 0;
    if (((local_681 & 1) != 0) && (local_1089 = 0, (MaxLevel >> 1 & 1) != 0)) {
      local_1089 = local_57a;
    }
    local_140 = &local_7e8;
    local_148 = "avx512vbmi";
    strlen("avx512vbmi");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_7e8);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_1089 & 1);
    local_10b1 = (local_681 & 1) != 0 && (MaxLevel >> 4 & 1) != 0;
    local_130 = &local_7f8;
    local_138 = "pku";
    strlen("pku");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_7f8);
    pSVar1 = _EBX;
    *pbVar4 = local_10b1;
    local_10d9 = (local_681 & 1) != 0 && (MaxLevel >> 5 & 1) != 0;
    local_120 = &local_808;
    local_128 = "waitpkg";
    strlen("waitpkg");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_808);
    pSVar1 = _EBX;
    *pbVar4 = local_10d9;
    local_1101 = 0;
    if (((local_681 & 1) != 0) && (local_1101 = 0, (MaxLevel >> 6 & 1) != 0)) {
      local_1101 = local_57a;
    }
    local_110 = &local_818;
    local_118 = "avx512vbmi2";
    strlen("avx512vbmi2");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_818);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_1101 & 1);
    local_1129 = (local_681 & 1) != 0 && (MaxLevel >> 7 & 1) != 0;
    local_100 = &local_828;
    local_108 = "shstk";
    strlen("shstk");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_828);
    pSVar1 = _EBX;
    *pbVar4 = local_1129;
    local_1151 = (local_681 & 1) != 0 && (MaxLevel >> 8 & 1) != 0;
    local_f0 = &local_838;
    local_f8 = "gfni";
    strlen("gfni");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_838);
    pSVar1 = _EBX;
    *pbVar4 = local_1151;
    local_1179 = 0;
    if (((local_681 & 1) != 0) && (local_1179 = 0, (MaxLevel >> 9 & 1) != 0)) {
      local_1179 = local_579;
    }
    local_e0 = &local_848;
    local_e8 = "vaes";
    strlen("vaes");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_848);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_1179 & 1);
    local_11a1 = 0;
    if (((local_681 & 1) != 0) && (local_11a1 = 0, (MaxLevel >> 10 & 1) != 0)) {
      local_11a1 = local_579;
    }
    local_d0 = &local_858;
    local_d8 = "vpclmulqdq";
    strlen("vpclmulqdq");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_858);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_11a1 & 1);
    local_11c9 = 0;
    if (((local_681 & 1) != 0) && (local_11c9 = 0, (MaxLevel >> 0xb & 1) != 0)) {
      local_11c9 = local_57a;
    }
    local_c0 = &local_868;
    local_c8 = "avx512vnni";
    strlen("avx512vnni");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_868);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_11c9 & 1);
    local_11f1 = 0;
    if (((local_681 & 1) != 0) && (local_11f1 = 0, (MaxLevel >> 0xc & 1) != 0)) {
      local_11f1 = local_57a;
    }
    local_b0 = &local_878;
    local_b8 = "avx512bitalg";
    strlen("avx512bitalg");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_878);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_11f1 & 1);
    local_1219 = 0;
    if (((local_681 & 1) != 0) && (local_1219 = 0, (MaxLevel >> 0xe & 1) != 0)) {
      local_1219 = local_57a;
    }
    local_a0 = &local_888;
    local_a8 = "avx512vpopcntdq";
    strlen("avx512vpopcntdq");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_888);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_1219 & 1);
    local_1241 = (local_681 & 1) != 0 && (MaxLevel >> 0x16 & 1) != 0;
    local_90 = &local_898;
    local_98 = "rdpid";
    strlen("rdpid");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_898);
    pSVar1 = _EBX;
    *pbVar4 = local_1241;
    local_1269 = (local_681 & 1) != 0 && (MaxLevel >> 0x19 & 1) != 0;
    local_80 = &local_8a8;
    local_88 = "cldemote";
    strlen("cldemote");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_8a8);
    pSVar1 = _EBX;
    *pbVar4 = local_1269;
    local_1291 = (local_681 & 1) != 0 && (MaxLevel >> 0x1b & 1) != 0;
    local_70 = &local_8b8;
    local_78 = "movdiri";
    strlen("movdiri");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_8b8);
    pSVar1 = _EBX;
    *pbVar4 = local_1291;
    local_12b9 = (local_681 & 1) != 0 && (MaxLevel >> 0x1c & 1) != 0;
    local_60 = &local_8c8;
    local_68 = "movdir64b";
    strlen("movdir64b");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_8c8);
    pSVar1 = _EBX;
    *pbVar4 = local_12b9;
    local_12e1 = (local_681 & 1) != 0 && (text.u[2] >> 0x12 & 1) != 0;
    local_50 = auStack_8d8;
    local_58 = "pconfig";
    strlen("pconfig");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,_auStack_8d8);
    *pbVar4 = local_12e1;
    local_1309 = 0;
    if (0xc < text.u[1]) {
      bVar2 = getX86CpuIDAndInfoEx(0xd,1,&ECX,&EDX,&MaxLevel,text.u + 2);
      local_1309 = bVar2 ^ 0xff;
    }
    pSVar1 = _EBX;
    local_8d9 = local_1309 & 1;
    local_130a = 0;
    if ((local_8d9 != 0) && (local_130a = 0, (ECX & 1) != 0)) {
      local_130a = local_579;
    }
    local_40 = &local_8f0;
    local_48 = "xsaveopt";
    strlen("xsaveopt");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_8f0);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_130a & 1);
    local_1331 = 0;
    if (((local_8d9 & 1) != 0) && (local_1331 = 0, (ECX >> 1 & 1) != 0)) {
      local_1331 = local_579;
    }
    local_30 = &local_900;
    local_38 = "xsavec";
    strlen("xsavec");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_900);
    pSVar1 = _EBX;
    *pbVar4 = (bool)(local_1331 & 1);
    local_1359 = 0;
    if (((local_8d9 & 1) != 0) && (local_1359 = 0, (ECX >> 3 & 1) != 0)) {
      local_1359 = local_579;
    }
    local_20 = auStack_910;
    local_28 = "xsaves";
    strlen("xsaves");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,_auStack_910);
    *pbVar4 = (bool)(local_1359 & 1);
    local_1381 = 0;
    if (0x13 < text.u[1]) {
      bVar2 = getX86CpuIDAndInfoEx(0x14,0,&ECX,&EDX,&MaxLevel,text.u + 2);
      local_1381 = bVar2 ^ 0xff;
    }
    pSVar1 = _EBX;
    local_911 = local_1381 & 1;
    local_1382 = local_911 != 0 && (EDX >> 4 & 1) != 0;
    local_10 = &local_928;
    local_18 = "ptwrite";
    strlen("ptwrite");
    pbVar4 = StringMap<bool,_llvm::MallocAllocator>::operator[](pSVar1,local_928);
    *pbVar4 = local_1382;
    Features_local._7_1_ = true;
  }
  return Features_local._7_1_;
}

Assistant:

bool sys::getHostCPUFeatures(StringMap<bool> &Features) {
  unsigned EAX = 0, EBX = 0, ECX = 0, EDX = 0;
  unsigned MaxLevel;
  union {
    unsigned u[3];
    char c[12];
  } text;

  if (getX86CpuIDAndInfo(0, &MaxLevel, text.u + 0, text.u + 2, text.u + 1) ||
      MaxLevel < 1)
    return false;

  getX86CpuIDAndInfo(1, &EAX, &EBX, &ECX, &EDX);

  Features["cmov"]   = (EDX >> 15) & 1;
  Features["mmx"]    = (EDX >> 23) & 1;
  Features["sse"]    = (EDX >> 25) & 1;
  Features["sse2"]   = (EDX >> 26) & 1;

  Features["sse3"]   = (ECX >>  0) & 1;
  Features["pclmul"] = (ECX >>  1) & 1;
  Features["ssse3"]  = (ECX >>  9) & 1;
  Features["cx16"]   = (ECX >> 13) & 1;
  Features["sse4.1"] = (ECX >> 19) & 1;
  Features["sse4.2"] = (ECX >> 20) & 1;
  Features["movbe"]  = (ECX >> 22) & 1;
  Features["popcnt"] = (ECX >> 23) & 1;
  Features["aes"]    = (ECX >> 25) & 1;
  Features["rdrnd"]  = (ECX >> 30) & 1;

  // If CPUID indicates support for XSAVE, XRESTORE and AVX, and XGETBV
  // indicates that the AVX registers will be saved and restored on context
  // switch, then we have full AVX support.
  bool HasAVXSave = ((ECX >> 27) & 1) && ((ECX >> 28) & 1) &&
                    !getX86XCR0(&EAX, &EDX) && ((EAX & 0x6) == 0x6);
  // AVX512 requires additional context to be saved by the OS.
  bool HasAVX512Save = HasAVXSave && ((EAX & 0xe0) == 0xe0);

  Features["avx"]   = HasAVXSave;
  Features["fma"]   = ((ECX >> 12) & 1) && HasAVXSave;
  // Only enable XSAVE if OS has enabled support for saving YMM state.
  Features["xsave"] = ((ECX >> 26) & 1) && HasAVXSave;
  Features["f16c"]  = ((ECX >> 29) & 1) && HasAVXSave;

  unsigned MaxExtLevel;
  getX86CpuIDAndInfo(0x80000000, &MaxExtLevel, &EBX, &ECX, &EDX);

  bool HasExtLeaf1 = MaxExtLevel >= 0x80000001 &&
                     !getX86CpuIDAndInfo(0x80000001, &EAX, &EBX, &ECX, &EDX);
  Features["sahf"]   = HasExtLeaf1 && ((ECX >>  0) & 1);
  Features["lzcnt"]  = HasExtLeaf1 && ((ECX >>  5) & 1);
  Features["sse4a"]  = HasExtLeaf1 && ((ECX >>  6) & 1);
  Features["prfchw"] = HasExtLeaf1 && ((ECX >>  8) & 1);
  Features["xop"]    = HasExtLeaf1 && ((ECX >> 11) & 1) && HasAVXSave;
  Features["lwp"]    = HasExtLeaf1 && ((ECX >> 15) & 1);
  Features["fma4"]   = HasExtLeaf1 && ((ECX >> 16) & 1) && HasAVXSave;
  Features["tbm"]    = HasExtLeaf1 && ((ECX >> 21) & 1);
  Features["mwaitx"] = HasExtLeaf1 && ((ECX >> 29) & 1);

  // Miscellaneous memory related features, detected by
  // using the 0x80000008 leaf of the CPUID instruction
  bool HasExtLeaf8 = MaxExtLevel >= 0x80000008 &&
                     !getX86CpuIDAndInfo(0x80000008, &EAX, &EBX, &ECX, &EDX);
  Features["clzero"]   = HasExtLeaf8 && ((EBX >> 0) & 1);
  Features["wbnoinvd"] = HasExtLeaf8 && ((EBX >> 9) & 1);

  bool HasLeaf7 =
      MaxLevel >= 7 && !getX86CpuIDAndInfoEx(0x7, 0x0, &EAX, &EBX, &ECX, &EDX);

  Features["fsgsbase"]   = HasLeaf7 && ((EBX >>  0) & 1);
  Features["sgx"]        = HasLeaf7 && ((EBX >>  2) & 1);
  Features["bmi"]        = HasLeaf7 && ((EBX >>  3) & 1);
  // AVX2 is only supported if we have the OS save support from AVX.
  Features["avx2"]       = HasLeaf7 && ((EBX >>  5) & 1) && HasAVXSave;
  Features["bmi2"]       = HasLeaf7 && ((EBX >>  8) & 1);
  Features["invpcid"]    = HasLeaf7 && ((EBX >> 10) & 1);
  Features["rtm"]        = HasLeaf7 && ((EBX >> 11) & 1);
  // AVX512 is only supported if the OS supports the context save for it.
  Features["avx512f"]    = HasLeaf7 && ((EBX >> 16) & 1) && HasAVX512Save;
  Features["avx512dq"]   = HasLeaf7 && ((EBX >> 17) & 1) && HasAVX512Save;
  Features["rdseed"]     = HasLeaf7 && ((EBX >> 18) & 1);
  Features["adx"]        = HasLeaf7 && ((EBX >> 19) & 1);
  Features["avx512ifma"] = HasLeaf7 && ((EBX >> 21) & 1) && HasAVX512Save;
  Features["clflushopt"] = HasLeaf7 && ((EBX >> 23) & 1);
  Features["clwb"]       = HasLeaf7 && ((EBX >> 24) & 1);
  Features["avx512pf"]   = HasLeaf7 && ((EBX >> 26) & 1) && HasAVX512Save;
  Features["avx512er"]   = HasLeaf7 && ((EBX >> 27) & 1) && HasAVX512Save;
  Features["avx512cd"]   = HasLeaf7 && ((EBX >> 28) & 1) && HasAVX512Save;
  Features["sha"]        = HasLeaf7 && ((EBX >> 29) & 1);
  Features["avx512bw"]   = HasLeaf7 && ((EBX >> 30) & 1) && HasAVX512Save;
  Features["avx512vl"]   = HasLeaf7 && ((EBX >> 31) & 1) && HasAVX512Save;

  Features["prefetchwt1"]     = HasLeaf7 && ((ECX >>  0) & 1);
  Features["avx512vbmi"]      = HasLeaf7 && ((ECX >>  1) & 1) && HasAVX512Save;
  Features["pku"]             = HasLeaf7 && ((ECX >>  4) & 1);
  Features["waitpkg"]         = HasLeaf7 && ((ECX >>  5) & 1);
  Features["avx512vbmi2"]     = HasLeaf7 && ((ECX >>  6) & 1) && HasAVX512Save;
  Features["shstk"]           = HasLeaf7 && ((ECX >>  7) & 1);
  Features["gfni"]            = HasLeaf7 && ((ECX >>  8) & 1);
  Features["vaes"]            = HasLeaf7 && ((ECX >>  9) & 1) && HasAVXSave;
  Features["vpclmulqdq"]      = HasLeaf7 && ((ECX >> 10) & 1) && HasAVXSave;
  Features["avx512vnni"]      = HasLeaf7 && ((ECX >> 11) & 1) && HasAVX512Save;
  Features["avx512bitalg"]    = HasLeaf7 && ((ECX >> 12) & 1) && HasAVX512Save;
  Features["avx512vpopcntdq"] = HasLeaf7 && ((ECX >> 14) & 1) && HasAVX512Save;
  Features["rdpid"]           = HasLeaf7 && ((ECX >> 22) & 1);
  Features["cldemote"]        = HasLeaf7 && ((ECX >> 25) & 1);
  Features["movdiri"]         = HasLeaf7 && ((ECX >> 27) & 1);
  Features["movdir64b"]       = HasLeaf7 && ((ECX >> 28) & 1);

  // There are two CPUID leafs which information associated with the pconfig
  // instruction:
  // EAX=0x7, ECX=0x0 indicates the availability of the instruction (via the 18th
  // bit of EDX), while the EAX=0x1b leaf returns information on the
  // availability of specific pconfig leafs.
  // The target feature here only refers to the the first of these two.
  // Users might need to check for the availability of specific pconfig
  // leaves using cpuid, since that information is ignored while
  // detecting features using the "-march=native" flag.
  // For more info, see X86 ISA docs.
  Features["pconfig"] = HasLeaf7 && ((EDX >> 18) & 1);

  bool HasLeafD = MaxLevel >= 0xd &&
                  !getX86CpuIDAndInfoEx(0xd, 0x1, &EAX, &EBX, &ECX, &EDX);

  // Only enable XSAVE if OS has enabled support for saving YMM state.
  Features["xsaveopt"] = HasLeafD && ((EAX >> 0) & 1) && HasAVXSave;
  Features["xsavec"]   = HasLeafD && ((EAX >> 1) & 1) && HasAVXSave;
  Features["xsaves"]   = HasLeafD && ((EAX >> 3) & 1) && HasAVXSave;

  bool HasLeaf14 = MaxLevel >= 0x14 &&
                  !getX86CpuIDAndInfoEx(0x14, 0x0, &EAX, &EBX, &ECX, &EDX);

  Features["ptwrite"] = HasLeaf14 && ((EBX >> 4) & 1);

  return true;
}